

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateSignatureHashRequest,cfd::js::api::json::CreateSignatureHashResponse,cfd::js::api::CreateSignatureHashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateSignatureHashRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_710;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_658 [4];
  JsonClassBase<cfd::js::api::json::CreateSignatureHashResponse> local_638 [4];
  undefined1 local_618 [8];
  CreateSignatureHashResponse res_2;
  undefined1 local_5b8 [8];
  CreateSignatureHashResponseStruct response;
  CreateSignatureHashRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_1a0 [8];
  CreateSignatureHashRequest req;
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateSignatureHashRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txin_._288_8_ = call_function;
  CreateSignatureHashRequest::CreateSignatureHashRequest((CreateSignatureHashRequest *)local_1a0);
  core::JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest> *)local_1a0,
             request_message);
  CreateSignatureHashRequest::ConvertToStruct
            ((CreateSignatureHashRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateSignatureHashRequest *)local_1a0);
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateSignatureHashRequestStruct_&)>
  ::operator()((CreateSignatureHashResponseStruct *)local_5b8,call_function,
               (CreateSignatureHashRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateSignatureHashResponse::CreateSignatureHashResponse
              ((CreateSignatureHashResponse *)local_618);
    CreateSignatureHashResponse::ConvertFromStruct
              ((CreateSignatureHashResponse *)local_618,
               (CreateSignatureHashResponseStruct *)local_5b8);
    core::JsonClassBase<cfd::js::api::json::CreateSignatureHashResponse>::Serialize_abi_cxx11_
              (local_638);
    std::__cxx11::string::operator=((string *)this,(string *)local_638);
    std::__cxx11::string::~string((string *)local_638);
    CreateSignatureHashResponse::~CreateSignatureHashResponse
              ((CreateSignatureHashResponse *)local_618);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_710,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_658);
    std::__cxx11::string::operator=((string *)this,(string *)local_658);
    std::__cxx11::string::~string((string *)local_658);
    ErrorResponse::~ErrorResponse(&local_710);
  }
  res_2._87_1_ = 1;
  CreateSignatureHashResponseStruct::~CreateSignatureHashResponseStruct
            ((CreateSignatureHashResponseStruct *)local_5b8);
  CreateSignatureHashRequestStruct::~CreateSignatureHashRequestStruct
            ((CreateSignatureHashRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateSignatureHashRequest::~CreateSignatureHashRequest((CreateSignatureHashRequest *)local_1a0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}